

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte bVar1;
  stbi_uc sVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  long lVar11;
  uint in_ECX;
  uint in_EDX;
  char *pcVar12;
  byte *in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int i_1;
  stbi_uc *cur_2;
  stbi_uc scale;
  stbi_uc *in;
  stbi_uc *cur_1;
  int nk;
  int width;
  int filter_bytes;
  int filter;
  stbi_uc *prior;
  stbi_uc *cur;
  int img_n;
  int k;
  stbi__uint32 img_width_bytes;
  stbi__uint32 img_len;
  stbi__uint32 stride;
  stbi__uint32 j;
  stbi__uint32 i;
  stbi__context *s;
  int local_94;
  byte *local_80;
  char *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  long local_60;
  void *local_58;
  int local_48;
  uint local_38;
  int local_34;
  byte *local_18;
  int local_4;
  
  puVar4 = (uint *)*in_RDI;
  uVar5 = in_R8D * in_ECX;
  uVar3 = puVar4[2];
  pvVar10 = stbi__malloc(0x11d08e);
  in_RDI[3] = pvVar10;
  if (in_RDI[3] == 0) {
    local_4 = stbi__err("outofmem");
  }
  else {
    uVar6 = uVar3 * in_R8D * in_stack_00000008 + 7 >> 3;
    uVar7 = (uVar6 + 1) * in_R9D;
    if ((*puVar4 == in_R8D) && (puVar4[1] == in_R9D)) {
      if (in_EDX != uVar7) {
        iVar8 = stbi__err("not enough pixels");
        return iVar8;
      }
    }
    else if (in_EDX < uVar7) {
      iVar8 = stbi__err("not enough pixels");
      return iVar8;
    }
    local_18 = in_RSI;
    for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
      local_58 = (void *)(in_RDI[3] + (ulong)(uVar5 * local_38));
      local_60 = (long)local_58 - (ulong)uVar5;
      local_64 = (uint)*local_18;
      if (4 < local_64) {
        iVar8 = stbi__err("invalid filter");
        return iVar8;
      }
      local_6c = in_R8D;
      local_68 = uVar3;
      if (in_stack_00000008 < 8) {
        local_58 = (void *)((long)local_58 + (ulong)(in_R8D * in_ECX - uVar6));
        local_68 = 1;
        local_6c = uVar6;
      }
      if (local_38 == 0) {
        local_64 = (uint)first_row_filter[(int)local_64];
      }
      for (local_48 = 0; local_48 < (int)local_68; local_48 = local_48 + 1) {
        switch(local_64) {
        case 0:
          *(byte *)((long)local_58 + (long)local_48) = local_18[(long)local_48 + 1];
          break;
        case 1:
          *(byte *)((long)local_58 + (long)local_48) = local_18[(long)local_48 + 1];
          break;
        case 2:
          *(byte *)((long)local_58 + (long)local_48) =
               local_18[(long)local_48 + 1] + *(char *)(local_60 + local_48);
          break;
        case 3:
          *(byte *)((long)local_58 + (long)local_48) =
               local_18[(long)local_48 + 1] + (char)((int)(uint)*(byte *)(local_60 + local_48) >> 1)
          ;
          break;
        case 4:
          bVar1 = local_18[(long)local_48 + 1];
          iVar8 = stbi__paeth(0,(uint)*(byte *)(local_60 + local_48),0);
          *(byte *)((long)local_58 + (long)local_48) = bVar1 + (char)iVar8;
          break;
        case 5:
          *(byte *)((long)local_58 + (long)local_48) = local_18[(long)local_48 + 1];
          break;
        case 6:
          *(byte *)((long)local_58 + (long)local_48) = local_18[(long)local_48 + 1];
        }
      }
      if (in_stack_00000008 == 8) {
        if (uVar3 != in_ECX) {
          *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
        }
        local_18 = local_18 + (long)(int)uVar3 + 1;
        local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
        local_60 = local_60 + (int)in_ECX;
      }
      else {
        local_18 = local_18 + 2;
        local_58 = (void *)((long)local_58 + 1);
        local_60 = local_60 + 1;
      }
      if ((in_stack_00000008 < 8) || (uVar3 == in_ECX)) {
        iVar8 = (local_6c - 1) * uVar3;
        switch(local_64) {
        case 0:
          memcpy(local_58,local_18,(long)iVar8);
          break;
        case 1:
          for (local_48 = 0; local_48 < iVar8; local_48 = local_48 + 1) {
            *(byte *)((long)local_58 + (long)local_48) =
                 local_18[local_48] + *(char *)((long)local_58 + (long)(int)(local_48 - local_68));
          }
          break;
        case 2:
          for (local_48 = 0; local_48 < iVar8; local_48 = local_48 + 1) {
            *(byte *)((long)local_58 + (long)local_48) =
                 local_18[local_48] + *(char *)(local_60 + local_48);
          }
          break;
        case 3:
          for (local_48 = 0; local_48 < iVar8; local_48 = local_48 + 1) {
            *(byte *)((long)local_58 + (long)local_48) =
                 local_18[local_48] +
                 (char)((int)((uint)*(byte *)(local_60 + local_48) +
                             (uint)*(byte *)((long)local_58 + (long)(int)(local_48 - local_68))) >>
                       1);
          }
          break;
        case 4:
          for (local_48 = 0; local_48 < iVar8; local_48 = local_48 + 1) {
            bVar1 = local_18[local_48];
            iVar9 = stbi__paeth((uint)*(byte *)((long)local_58 + (long)(int)(local_48 - local_68)),
                                (uint)*(byte *)(local_60 + local_48),
                                (uint)*(byte *)(local_60 + (int)(local_48 - local_68)));
            *(byte *)((long)local_58 + (long)local_48) = bVar1 + (char)iVar9;
          }
          break;
        case 5:
          for (local_48 = 0; local_48 < iVar8; local_48 = local_48 + 1) {
            *(byte *)((long)local_58 + (long)local_48) =
                 local_18[local_48] +
                 (char)((int)(uint)*(byte *)((long)local_58 + (long)(int)(local_48 - local_68)) >> 1
                       );
          }
          break;
        case 6:
          for (local_48 = 0; local_48 < iVar8; local_48 = local_48 + 1) {
            bVar1 = local_18[local_48];
            iVar9 = stbi__paeth((uint)*(byte *)((long)local_58 + (long)(int)(local_48 - local_68)),0
                                ,0);
            *(byte *)((long)local_58 + (long)local_48) = bVar1 + (char)iVar9;
          }
        }
        local_18 = local_18 + iVar8;
      }
      else {
        switch(local_64) {
        case 0:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              *(byte *)((long)local_58 + (long)local_48) = local_18[local_48];
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
          }
          break;
        case 1:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              *(byte *)((long)local_58 + (long)local_48) =
                   local_18[local_48] + *(char *)((long)local_58 + (long)(int)(local_48 - in_ECX));
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
          }
          break;
        case 2:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              *(byte *)((long)local_58 + (long)local_48) =
                   local_18[local_48] + *(char *)(local_60 + local_48);
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
            local_60 = local_60 + (int)in_ECX;
          }
          break;
        case 3:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              *(byte *)((long)local_58 + (long)local_48) =
                   local_18[local_48] +
                   (char)((int)((uint)*(byte *)(local_60 + local_48) +
                               (uint)*(byte *)((long)local_58 + (long)(int)(local_48 - in_ECX))) >>
                         1);
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
            local_60 = local_60 + (int)in_ECX;
          }
          break;
        case 4:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              bVar1 = local_18[local_48];
              iVar8 = stbi__paeth((uint)*(byte *)((long)local_58 + (long)(int)(local_48 - in_ECX)),
                                  (uint)*(byte *)(local_60 + local_48),
                                  (uint)*(byte *)(local_60 + (int)(local_48 - in_ECX)));
              *(byte *)((long)local_58 + (long)local_48) = bVar1 + (char)iVar8;
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
            local_60 = local_60 + (int)in_ECX;
          }
          break;
        case 5:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              *(byte *)((long)local_58 + (long)local_48) =
                   local_18[local_48] +
                   (char)((int)(uint)*(byte *)((long)local_58 + (long)(int)(local_48 - in_ECX)) >> 1
                         );
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
          }
          break;
        case 6:
          local_34 = in_R8D - 1;
          while (local_34 != 0) {
            for (local_48 = 0; local_48 < (int)uVar3; local_48 = local_48 + 1) {
              bVar1 = local_18[local_48];
              iVar8 = stbi__paeth((uint)*(byte *)((long)local_58 + (long)(int)(local_48 - in_ECX)),0
                                  ,0);
              *(byte *)((long)local_58 + (long)local_48) = bVar1 + (char)iVar8;
            }
            local_34 = local_34 + -1;
            *(undefined1 *)((long)local_58 + (long)(int)uVar3) = 0xff;
            local_18 = local_18 + (int)uVar3;
            local_58 = (void *)((long)local_58 + (long)(int)in_ECX);
          }
        }
      }
    }
    if (in_stack_00000008 < 8) {
      for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
        local_78 = (char *)(in_RDI[3] + (ulong)(uVar5 * local_38));
        local_80 = (byte *)((in_RDI[3] + (ulong)(uVar5 * local_38) + (ulong)(in_R8D * in_ECX)) -
                           (ulong)uVar6);
        if (in_stack_00000010 == 0) {
          sVar2 = stbi__depth_scale_table[in_stack_00000008];
        }
        else {
          sVar2 = '\x01';
        }
        if (in_stack_00000008 == 4) {
          for (local_48 = in_R8D * uVar3; 1 < local_48; local_48 = local_48 + -2) {
            pcVar12 = local_78 + 1;
            *local_78 = sVar2 * (char)((int)(uint)*local_80 >> 4);
            local_78 = local_78 + 2;
            *pcVar12 = sVar2 * (*local_80 & 0xf);
            local_80 = local_80 + 1;
          }
          if (0 < local_48) {
            *local_78 = sVar2 * (char)((int)(uint)*local_80 >> 4);
          }
        }
        else if (in_stack_00000008 == 2) {
          for (local_48 = in_R8D * uVar3; 3 < local_48; local_48 = local_48 + -4) {
            *local_78 = sVar2 * (char)((int)(uint)*local_80 >> 6);
            local_78[1] = sVar2 * ((byte)((int)(uint)*local_80 >> 4) & 3);
            pcVar12 = local_78 + 3;
            local_78[2] = sVar2 * ((byte)((int)(uint)*local_80 >> 2) & 3);
            local_78 = local_78 + 4;
            *pcVar12 = sVar2 * (*local_80 & 3);
            local_80 = local_80 + 1;
          }
          if (0 < local_48) {
            *local_78 = sVar2 * (char)((int)(uint)*local_80 >> 6);
            local_78 = local_78 + 1;
          }
          if (1 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 4) & 3);
            local_78 = local_78 + 1;
          }
          if (2 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 2) & 3);
          }
        }
        else if (in_stack_00000008 == 1) {
          for (local_48 = in_R8D * uVar3; 7 < local_48; local_48 = local_48 + -8) {
            *local_78 = sVar2 * (char)((int)(uint)*local_80 >> 7);
            local_78[1] = sVar2 * ((byte)((int)(uint)*local_80 >> 6) & 1);
            local_78[2] = sVar2 * ((byte)((int)(uint)*local_80 >> 5) & 1);
            local_78[3] = sVar2 * ((byte)((int)(uint)*local_80 >> 4) & 1);
            local_78[4] = sVar2 * ((byte)((int)(uint)*local_80 >> 3) & 1);
            local_78[5] = sVar2 * ((byte)((int)(uint)*local_80 >> 2) & 1);
            pcVar12 = local_78 + 7;
            local_78[6] = sVar2 * ((byte)((int)(uint)*local_80 >> 1) & 1);
            local_78 = local_78 + 8;
            *pcVar12 = sVar2 * (*local_80 & 1);
            local_80 = local_80 + 1;
          }
          if (0 < local_48) {
            *local_78 = sVar2 * (char)((int)(uint)*local_80 >> 7);
            local_78 = local_78 + 1;
          }
          if (1 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 6) & 1);
            local_78 = local_78 + 1;
          }
          if (2 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 5) & 1);
            local_78 = local_78 + 1;
          }
          if (3 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 4) & 1);
            local_78 = local_78 + 1;
          }
          if (4 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 3) & 1);
            local_78 = local_78 + 1;
          }
          if (5 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 2) & 1);
            local_78 = local_78 + 1;
          }
          if (6 < local_48) {
            *local_78 = sVar2 * ((byte)((int)(uint)*local_80 >> 1) & 1);
          }
        }
        if (uVar3 != in_ECX) {
          lVar11 = in_RDI[3] + (ulong)(uVar5 * local_38);
          if (uVar3 == 1) {
            for (local_94 = in_R8D - 1; -1 < local_94; local_94 = local_94 + -1) {
              *(undefined1 *)(lVar11 + (local_94 * 2 + 1)) = 0xff;
              *(undefined1 *)(lVar11 + (local_94 << 1)) = *(undefined1 *)(lVar11 + local_94);
            }
          }
          else {
            for (local_94 = in_R8D - 1; -1 < local_94; local_94 = local_94 + -1) {
              *(undefined1 *)(lVar11 + (local_94 * 4 + 3)) = 0xff;
              *(undefined1 *)(lVar11 + (local_94 * 4 + 2)) =
                   *(undefined1 *)(lVar11 + (local_94 * 3 + 2));
              *(undefined1 *)(lVar11 + (local_94 * 4 + 1)) =
                   *(undefined1 *)(lVar11 + (local_94 * 3 + 1));
              *(undefined1 *)(lVar11 + (local_94 << 2)) = *(undefined1 *)(lVar11 + local_94 * 3);
            }
          }
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}